

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

extent_t * base_alloc_extent(tsdn_t *tsdn,base_t *base)

{
  uint in_EAX;
  extent_t *peVar1;
  size_t esn;
  uint local_8 [2];
  
  local_8[0] = in_EAX;
  peVar1 = (extent_t *)base_alloc_impl(tsdn,base,0x80,0x40,(size_t *)local_8);
  if (peVar1 == (extent_t *)0x0) {
    peVar1 = (extent_t *)0x0;
  }
  else {
    (peVar1->field_2).e_size_esn =
         (ulong)(local_8[0] & 0xfff) | (peVar1->field_2).e_size_esn & 0xfffffffffffff000;
  }
  return peVar1;
}

Assistant:

extent_t *
base_alloc_extent(tsdn_t *tsdn, base_t *base) {
	size_t esn;
	extent_t *extent = base_alloc_impl(tsdn, base, sizeof(extent_t),
	    CACHELINE, &esn);
	if (extent == NULL) {
		return NULL;
	}
	extent_esn_set(extent, esn);
	return extent;
}